

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O3

bool __thiscall duckdb::TableFunction::Equal(TableFunction *this,TableFunction *rhs)

{
  pointer pLVar1;
  pointer pLVar2;
  bool bVar3;
  const_reference this_00;
  const_reference rhs_00;
  size_type __n;
  
  pLVar1 = (this->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = *(pointer *)
            ((long)&(this->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if ((long)pLVar2 - (long)pLVar1 !=
      (long)*(pointer *)
             ((long)&(rhs->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data + 8) -
      (long)(rhs->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) {
    return false;
  }
  if (pLVar2 != pLVar1) {
    __n = 0;
    do {
      this_00 = vector<duckdb::LogicalType,_true>::operator[]
                          (&(this->super_SimpleNamedParameterFunction).super_SimpleFunction.
                            arguments,__n);
      rhs_00 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(rhs->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments,
                          __n);
      bVar3 = LogicalType::operator==(this_00,rhs_00);
      if (!bVar3) {
        return false;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)*(pointer *)
                                   ((long)&(this->super_SimpleNamedParameterFunction).
                                           super_SimpleFunction.arguments.
                                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           .
                                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                            (long)(this->super_SimpleNamedParameterFunction).super_SimpleFunction.
                                  arguments.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  bVar3 = LogicalType::operator==
                    (&(this->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs,
                     &(rhs->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs);
  return bVar3;
}

Assistant:

bool TableFunction::Equal(const TableFunction &rhs) const {
	// number of types
	if (this->arguments.size() != rhs.arguments.size()) {
		return false;
	}
	// argument types
	for (idx_t i = 0; i < this->arguments.size(); ++i) {
		if (this->arguments[i] != rhs.arguments[i]) {
			return false;
		}
	}
	// varargs
	if (this->varargs != rhs.varargs) {
		return false;
	}

	return true; // they are equal
}